

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::initTexture(ShaderTextureFunctionCase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  Texture2D *this_00;
  Texture2D *pTVar11;
  TextureCube *this_01;
  Vector<int,_4> *a;
  TextureCube *pTVar12;
  Texture2DArray *this_02;
  Texture2DArray *pTVar13;
  Texture3D *this_03;
  Texture3D *pTVar14;
  PixelBufferAccess *pPVar15;
  int *piVar16;
  Vec4 *this_04;
  Vec4 *this_05;
  float fVar17;
  CubeFaceFloatCoords CVar18;
  float local_6a4;
  float local_664;
  float local_5b4;
  float local_57c;
  float local_56c;
  TextureBinding local_560;
  float local_514;
  float local_510;
  float dwdy;
  float dwdx;
  float dvdy_3;
  float dudx_3;
  Vector<float,_4> local_4f4;
  undefined1 local_4e4 [8];
  Vec4 colorB_3;
  Vector<float,_4> local_4c4;
  undefined1 local_4b4 [8];
  Vec4 colorA_3;
  float fB_3;
  float fA_3;
  int level_3;
  int baseCellSize_3;
  Vec4 cBias_3;
  Vec4 cScale_3;
  float levelStep_3;
  float dvdy_2;
  float dudx_2;
  Vector<float,_4> local_3f4;
  Vector<float,_4> local_3e4;
  undefined1 local_3d4 [8];
  Vec4 colorB_2;
  Vector<float,_4> local_3b4;
  undefined1 local_3a4 [8];
  Vec4 colorA_2;
  float fB_2;
  float fA_2;
  int layer;
  PixelBufferAccess levelAccess;
  int level_2;
  int baseCellSize_2;
  Vec4 cBias_2;
  Vec4 cScale_2;
  float levelStep_2;
  float layerStep;
  float local_2e8;
  float local_2e4;
  float dvdy_1;
  float dudx_1;
  float local_2d8;
  Vector<float,_3> local_2d0;
  undefined8 local_2c4;
  CubeFaceFloatCoords c01;
  float local_2b0;
  Vector<float,_3> local_2a4;
  float local_298;
  float fStack_294;
  CubeFaceFloatCoords c10;
  float local_280;
  Vector<float,_3> local_274;
  undefined8 local_268;
  CubeFaceFloatCoords c00;
  int lastPix;
  PixelBufferAccess access;
  Vector<float,_4> local_220;
  undefined1 local_210 [8];
  Vec4 colorB_1;
  Vector<float,_4> local_1f0;
  undefined1 local_1e0 [8];
  Vec4 colorA_1;
  IVec4 swzB;
  IVec4 *swzA;
  int face;
  Vec2 f;
  float fB_1;
  float fA_1;
  int level_1;
  int baseCellSize_1;
  undefined1 local_18c [8];
  Vec4 cCorner;
  Vec4 cBias_1;
  Vec4 cScale_1;
  float levelStep_1;
  float dvdy;
  float dudx;
  Vector<float,_4> local_f8;
  undefined1 local_e8 [8];
  Vec4 colorB;
  Vector<float,_4> local_c8;
  undefined1 local_b8 [8];
  Vec4 colorA;
  float fB;
  float fA;
  int level;
  int baseCellSize;
  Vec4 cBias;
  Vec4 cScale;
  float levelStep;
  float proj;
  bool isAutoLod;
  bool isProj;
  IVec2 viewportSize;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  ShaderTextureFunctionCase *this_local;
  
  if ((initTexture()::texCubeSwz == '\0') &&
     (iVar7 = __cxa_guard_acquire(&initTexture()::texCubeSwz), iVar7 != 0)) {
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz,0,0,1,1);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 1,1,1,0,0);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 2,0,1,0,1);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 3,1,0,1,0);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 4,0,1,1,0);
    tcu::Vector<int,_4>::Vector(initTexture::texCubeSwz + 5,1,0,0,1);
    __cxa_guard_release(&initTexture()::texCubeSwz);
  }
  fmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat((this->m_textureSpec).format);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&viewportSize,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  deqp::gls::ShaderRenderCase::getViewportSize((ShaderRenderCase *)&proj);
  bVar5 = anon_unknown_1::functionHasProj((this->m_lookupSpec).function);
  bVar6 = anon_unknown_1::functionHasAutoLod
                    ((uint)(((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0),
                     (this->m_lookupSpec).function);
  if (bVar5) {
    iVar7 = 3;
    if ((this->m_lookupSpec).function == FUNCTION_TEXTUREPROJ3) {
      iVar7 = 2;
    }
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,iVar7);
    local_56c = 1.0 / *pfVar10;
  }
  else {
    local_56c = 1.0;
  }
  switch((this->m_textureSpec).type) {
  case TEXTURETYPE_2D:
    if (bVar6) {
      local_57c = 0.0;
    }
    else {
      iVar7 = de::max<int>(1,(this->m_textureSpec).numLevels + -1);
      local_57c = 1.0 / (float)iVar7;
    }
    tcu::operator-((tcu *)(cBias.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)&viewportSize);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&level,(Vector<float,_4> *)&viewportSize);
    iVar7 = (this->m_textureSpec).width;
    iVar9 = (this->m_textureSpec).height;
    if (iVar7 < 0) {
      iVar7 = iVar7 + 3;
    }
    if (iVar9 < 0) {
      iVar9 = iVar9 + 3;
    }
    iVar7 = de::min<int>(iVar7 >> 2,iVar9 >> 2);
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).width,(this->m_textureSpec).height);
    this->m_texture2D = this_00;
    for (fB = 0.0; (int)fB < (this->m_textureSpec).numLevels; fB = (float)((int)fB + 1)) {
      colorA.m_data[3] = (float)(int)fB * local_57c;
      colorA.m_data[2] = 1.0 - colorA.m_data[3];
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(colorB.m_data + 2),colorA.m_data[3],colorA.m_data[2],
                 colorA.m_data[3],colorA.m_data[2]);
      tcu::operator*((tcu *)&local_c8,(Vector<float,_4> *)(cBias.m_data + 2),
                     (Vector<float,_4> *)(colorB.m_data + 2));
      tcu::operator+((tcu *)local_b8,(Vector<float,_4> *)&level,&local_c8);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&dvdy,colorA.m_data[2],colorA.m_data[3],colorA.m_data[2],
                 colorA.m_data[3]);
      tcu::operator*((tcu *)&local_f8,(Vector<float,_4> *)(cBias.m_data + 2),
                     (Vector<float,_4> *)&dvdy);
      tcu::operator+((tcu *)local_e8,(Vector<float,_4> *)&level,&local_f8);
      pTVar11 = glu::Texture2D::getRefTexture(this->m_texture2D);
      tcu::Texture2D::allocLevel(pTVar11,(int)fB);
      pTVar11 = glu::Texture2D::getRefTexture(this->m_texture2D);
      pPVar15 = tcu::TextureLevelPyramid::getLevel(&pTVar11->super_TextureLevelPyramid,(int)fB);
      iVar9 = de::max<int>(1,iVar7 >> (SUB41(fB,0) & 0x1f));
      tcu::fillWithGrid(pPVar15,iVar9,(Vec4 *)local_b8,(Vec4 *)local_e8);
    }
    (*this->m_texture2D->_vptr_Texture2D[2])();
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,0);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,0);
    fVar3 = *pfVar10;
    iVar7 = (this->m_textureSpec).width;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,0);
    iVar9 = *piVar16;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,1);
    fVar1 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,1);
    fVar2 = *pfVar10;
    iVar8 = (this->m_textureSpec).height;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,1);
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,((fVar17 - fVar3) * local_56c * (float)iVar7) / (float)iVar9,
                        0.0,0.0,((fVar1 - fVar2) * local_56c * (float)iVar8) / (float)*piVar16);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)(cScale_1.m_data + 3),this->m_texture2D,
               &(this->m_textureSpec).sampler);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,(value_type *)(cScale_1.m_data + 3));
    break;
  case TEXTURETYPE_CUBE_MAP:
    if (bVar6) {
      local_5b4 = 0.0;
    }
    else {
      iVar7 = de::max<int>(1,(this->m_textureSpec).numLevels + -1);
      local_5b4 = 1.0 / (float)iVar7;
    }
    cScale_1.m_data[2] = local_5b4;
    tcu::operator-((tcu *)(cBias_1.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)&viewportSize);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(cCorner.m_data + 2),(Vector<float,_4> *)&viewportSize);
    tcu::operator*((tcu *)&level_1,(Vector<float,_4> *)(cBias_1.m_data + 2),0.5);
    tcu::operator+((tcu *)local_18c,(Vector<float,_4> *)(cCorner.m_data + 2),
                   (Vector<float,_4> *)&level_1);
    iVar7 = (this->m_textureSpec).width;
    iVar9 = (this->m_textureSpec).height;
    if (iVar7 < 0) {
      iVar7 = iVar7 + 3;
    }
    if (iVar9 < 0) {
      iVar9 = iVar9 + 3;
    }
    iVar7 = de::min<int>(iVar7 >> 2,iVar9 >> 2);
    this_01 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (this_01,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).width);
    this->m_textureCube = this_01;
    for (fB_1 = 0.0; (int)fB_1 < (this->m_textureSpec).numLevels; fB_1 = (float)((int)fB_1 + 1)) {
      f.m_data[1] = (float)(int)fB_1 * cScale_1.m_data[2];
      f.m_data[0] = 1.0 - f.m_data[1];
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)((long)&swzA + 4),f.m_data[1],f.m_data[0]);
      for (swzA._0_4_ = CUBEFACE_NEGATIVE_X; (int)(CubeFace)swzA < 6;
          swzA._0_4_ = (CubeFace)swzA + CUBEFACE_POSITIVE_X) {
        a = initTexture::texCubeSwz + (int)(CubeFace)swzA;
        tcu::operator-((tcu *)(colorA_1.m_data + 2),1,a);
        piVar16 = tcu::Vector<int,_4>::operator[](a,0);
        iVar9 = *piVar16;
        piVar16 = tcu::Vector<int,_4>::operator[](a,1);
        iVar8 = *piVar16;
        piVar16 = tcu::Vector<int,_4>::operator[](a,2);
        iVar4 = *piVar16;
        tcu::Vector<int,_4>::operator[](a,3);
        tcu::Vector<float,_2>::swizzle
                  ((Vector<float,_2> *)(colorB_1.m_data + 2),(int)&swzA + 4,iVar9,iVar8,iVar4);
        tcu::operator*((tcu *)&local_1f0,(Vector<float,_4> *)(cBias_1.m_data + 2),
                       (Vector<float,_4> *)(colorB_1.m_data + 2));
        tcu::operator+((tcu *)local_1e0,(Vector<float,_4> *)(cCorner.m_data + 2),&local_1f0);
        piVar16 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(colorA_1.m_data + 2),0);
        iVar9 = *piVar16;
        piVar16 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(colorA_1.m_data + 2),1);
        iVar8 = *piVar16;
        piVar16 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(colorA_1.m_data + 2),2);
        iVar4 = *piVar16;
        tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(colorA_1.m_data + 2),3);
        tcu::Vector<float,_2>::swizzle
                  ((Vector<float,_2> *)&access.super_ConstPixelBufferAccess.m_data,(int)&swzA + 4,
                   iVar9,iVar8,iVar4);
        tcu::operator*((tcu *)&local_220,(Vector<float,_4> *)(cBias_1.m_data + 2),
                       (Vector<float,_4> *)&access.super_ConstPixelBufferAccess.m_data);
        tcu::operator+((tcu *)local_210,(Vector<float,_4> *)(cCorner.m_data + 2),&local_220);
        pTVar12 = glu::TextureCube::getRefTexture(this->m_textureCube);
        tcu::TextureCube::allocLevel(pTVar12,(CubeFace)swzA,(int)fB_1);
        pTVar12 = glu::TextureCube::getRefTexture(this->m_textureCube);
        pPVar15 = tcu::TextureCube::getLevelFace(pTVar12,(int)fB_1,(CubeFace)swzA);
        tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&c00.t,pPVar15);
        iVar9 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&c00.t);
        c00.s = (float)(iVar9 + -1);
        iVar9 = de::max<int>(1,iVar7 >> (SUB41(fB_1,0) & 0x1f));
        tcu::fillWithGrid((PixelBufferAccess *)&c00.t,iVar9,(Vec4 *)local_1e0,(Vec4 *)local_210);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&c00.t,(Vec4 *)local_18c,0,0,0);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&c00.t,(Vec4 *)local_18c,0,(int)c00.s,0);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&c00.t,(Vec4 *)local_18c,(int)c00.s,0,0);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&c00.t,(Vec4 *)local_18c,(int)c00.s,(int)c00.s,0);
      }
    }
    glu::TextureCube::upload(this->m_textureCube);
    this_04 = &(this->m_lookupSpec).minCoord;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_04,0);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_04,1);
    fVar3 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_04,2);
    tcu::Vector<float,_3>::Vector
              (&local_274,fVar17 * local_56c,fVar3 * local_56c,*pfVar10 * local_56c);
    join_0x00001200_0x00000000_ = tcu::getCubeFaceCoords(&local_274);
    c00.face = (CubeFace)local_280;
    local_268 = stack0xfffffffffffffd78;
    this_05 = &(this->m_lookupSpec).maxCoord;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_05,0);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_04,1);
    fVar3 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_04,2);
    tcu::Vector<float,_3>::Vector
              (&local_2a4,fVar17 * local_56c,fVar3 * local_56c,*pfVar10 * local_56c);
    CVar18 = tcu::getCubeFaceCoords(&local_2a4);
    local_2b0 = CVar18.t;
    c10.face = (CubeFace)local_2b0;
    c01._4_8_ = CVar18._0_8_;
    local_298 = c01.s;
    fStack_294 = c01.t;
    unique0x1000210f = CVar18;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_04,0);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_05,1);
    fVar3 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](this_04,2);
    tcu::Vector<float,_3>::Vector
              (&local_2d0,fVar17 * local_56c,fVar3 * local_56c,*pfVar10 * local_56c);
    _dvdy_1 = tcu::getCubeFaceCoords(&local_2d0);
    local_2c4 = _dvdy_1;
    c01.face = (CubeFace)local_2d8;
    fVar17 = fStack_294 - local_268._4_4_;
    iVar7 = (this->m_textureSpec).width;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,0);
    local_2e4 = (fVar17 * (float)iVar7) / (float)*piVar16;
    fVar17 = (float)c01.face - (float)c00.face;
    iVar7 = (this->m_textureSpec).height;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,1);
    local_2e8 = (fVar17 * (float)iVar7) / (float)*piVar16;
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,local_2e4,0.0,0.0,local_2e8);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&levelStep_2,this->m_textureCube,&(this->m_textureSpec).sampler);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,(value_type *)&levelStep_2);
    break;
  case TEXTURETYPE_2D_ARRAY:
    iVar7 = (this->m_textureSpec).depth;
    if (bVar6) {
      local_664 = 0.0;
    }
    else {
      iVar9 = de::max<int>(1,(this->m_textureSpec).numLevels + -1);
      local_664 = 1.0 / (float)(iVar9 * (this->m_textureSpec).depth);
    }
    tcu::operator-((tcu *)(cBias_2.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)&viewportSize);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&level_2,(Vector<float,_4> *)&viewportSize);
    iVar9 = (this->m_textureSpec).width;
    iVar8 = (this->m_textureSpec).height;
    if (iVar9 < 0) {
      iVar9 = iVar9 + 3;
    }
    if (iVar8 < 0) {
      iVar8 = iVar8 + 3;
    }
    levelAccess.super_ConstPixelBufferAccess.m_data._4_4_ = de::min<int>(iVar9 >> 2,iVar8 >> 2);
    this_02 = (Texture2DArray *)operator_new(0x70);
    glu::Texture2DArray::Texture2DArray
              (this_02,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).width,(this->m_textureSpec).height,(this->m_textureSpec).depth)
    ;
    this->m_texture2DArray = this_02;
    for (levelAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0;
        (int)levelAccess.super_ConstPixelBufferAccess.m_data < (this->m_textureSpec).numLevels;
        levelAccess.super_ConstPixelBufferAccess.m_data._0_4_ =
             (int)levelAccess.super_ConstPixelBufferAccess.m_data + 1) {
      pTVar13 = glu::Texture2DArray::getRefTexture(this->m_texture2DArray);
      tcu::Texture2DArray::allocLevel(pTVar13,(int)levelAccess.super_ConstPixelBufferAccess.m_data);
      pTVar13 = glu::Texture2DArray::getRefTexture(this->m_texture2DArray);
      pPVar15 = tcu::TextureLevelPyramid::getLevel
                          (&pTVar13->super_TextureLevelPyramid,
                           (int)levelAccess.super_ConstPixelBufferAccess.m_data);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&fA_2,pPVar15);
      for (fB_2 = 0.0;
          iVar9 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)&fA_2),
          (int)fB_2 < iVar9; fB_2 = (float)((int)fB_2 + 1)) {
        colorA_2.m_data[3] =
             (float)(int)fB_2 * (1.0 / (float)iVar7) +
             (float)(int)levelAccess.super_ConstPixelBufferAccess.m_data * local_664;
        colorA_2.m_data[2] = 1.0 - colorA_2.m_data[3];
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(colorB_2.m_data + 2),colorA_2.m_data[3],colorA_2.m_data[2],
                   colorA_2.m_data[3],colorA_2.m_data[2]);
        tcu::operator*((tcu *)&local_3b4,(Vector<float,_4> *)(cBias_2.m_data + 2),
                       (Vector<float,_4> *)(colorB_2.m_data + 2));
        tcu::operator+((tcu *)local_3a4,(Vector<float,_4> *)&level_2,&local_3b4);
        tcu::Vector<float,_4>::Vector
                  (&local_3f4,colorA_2.m_data[2],colorA_2.m_data[3],colorA_2.m_data[2],
                   colorA_2.m_data[3]);
        tcu::operator*((tcu *)&local_3e4,(Vector<float,_4> *)(cBias_2.m_data + 2),&local_3f4);
        tcu::operator+((tcu *)local_3d4,(Vector<float,_4> *)&level_2,&local_3e4);
        iVar9 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&fA_2);
        iVar8 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&fA_2);
        tcu::getSubregion((PixelBufferAccess *)&dvdy_2,(PixelBufferAccess *)&fA_2,0,0,(int)fB_2,
                          iVar9,iVar8,1);
        iVar9 = de::max<int>(1,levelAccess.super_ConstPixelBufferAccess.m_data._4_4_ >>
                               ((byte)(int)levelAccess.super_ConstPixelBufferAccess.m_data & 0x1f));
        tcu::fillWithGrid((PixelBufferAccess *)&dvdy_2,iVar9,(Vec4 *)local_3a4,(Vec4 *)local_3d4);
      }
    }
    glu::Texture2DArray::upload(this->m_texture2DArray);
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,0);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,0);
    fVar3 = *pfVar10;
    iVar7 = (this->m_textureSpec).width;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,0);
    iVar9 = *piVar16;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,1);
    fVar1 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,1);
    fVar2 = *pfVar10;
    iVar8 = (this->m_textureSpec).height;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,1);
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,((fVar17 - fVar3) * local_56c * (float)iVar7) / (float)iVar9,
                        0.0,0.0,((fVar1 - fVar2) * local_56c * (float)iVar8) / (float)*piVar16);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)(cScale_3.m_data + 3),this->m_texture2DArray,
               &(this->m_textureSpec).sampler);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,(value_type *)(cScale_3.m_data + 3));
    break;
  case TEXTURETYPE_3D:
    if (bVar6) {
      local_6a4 = 0.0;
    }
    else {
      iVar7 = de::max<int>(1,(this->m_textureSpec).numLevels + -1);
      local_6a4 = 1.0 / (float)iVar7;
    }
    cScale_3.m_data[2] = local_6a4;
    tcu::operator-((tcu *)(cBias_3.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)&viewportSize);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&level_3,(Vector<float,_4> *)&viewportSize);
    iVar7 = de::min<int>((this->m_textureSpec).width / 2,(this->m_textureSpec).height / 2);
    iVar7 = de::min<int>(iVar7,(this->m_textureSpec).depth / 2);
    this_03 = (Texture3D *)operator_new(0x70);
    glu::Texture3D::Texture3D
              (this_03,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).width,(this->m_textureSpec).height,(this->m_textureSpec).depth)
    ;
    this->m_texture3D = this_03;
    for (fB_3 = 0.0; (int)fB_3 < (this->m_textureSpec).numLevels; fB_3 = (float)((int)fB_3 + 1)) {
      colorA_3.m_data[3] = (float)(int)fB_3 * cScale_3.m_data[2];
      colorA_3.m_data[2] = 1.0 - colorA_3.m_data[3];
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(colorB_3.m_data + 2),colorA_3.m_data[3],colorA_3.m_data[2],
                 colorA_3.m_data[3],colorA_3.m_data[2]);
      tcu::operator*((tcu *)&local_4c4,(Vector<float,_4> *)(cBias_3.m_data + 2),
                     (Vector<float,_4> *)(colorB_3.m_data + 2));
      tcu::operator+((tcu *)local_4b4,(Vector<float,_4> *)&level_3,&local_4c4);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&dvdy_3,colorA_3.m_data[2],colorA_3.m_data[3],
                 colorA_3.m_data[2],colorA_3.m_data[3]);
      tcu::operator*((tcu *)&local_4f4,(Vector<float,_4> *)(cBias_3.m_data + 2),
                     (Vector<float,_4> *)&dvdy_3);
      tcu::operator+((tcu *)local_4e4,(Vector<float,_4> *)&level_3,&local_4f4);
      pTVar14 = glu::Texture3D::getRefTexture(this->m_texture3D);
      tcu::Texture3D::allocLevel(pTVar14,(int)fB_3);
      pTVar14 = glu::Texture3D::getRefTexture(this->m_texture3D);
      pPVar15 = tcu::TextureLevelPyramid::getLevel(&pTVar14->super_TextureLevelPyramid,(int)fB_3);
      iVar9 = de::max<int>(1,iVar7 >> (SUB41(fB_3,0) & 0x1f));
      tcu::fillWithGrid(pPVar15,iVar9,(Vec4 *)local_4b4,(Vec4 *)local_4e4);
    }
    glu::Texture3D::upload(this->m_texture3D);
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,0);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,0);
    fVar3 = *pfVar10;
    iVar7 = (this->m_textureSpec).width;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,0);
    dwdx = ((fVar17 - fVar3) * local_56c * (float)iVar7) / (float)*piVar16;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,1);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,1);
    fVar3 = *pfVar10;
    iVar7 = (this->m_textureSpec).height;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,1);
    dwdy = ((fVar17 - fVar3) * local_56c * (float)iVar7) / (float)*piVar16;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,2);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,2);
    fVar3 = *pfVar10;
    iVar7 = (this->m_textureSpec).depth;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,0);
    local_510 = ((fVar17 - fVar3) * 0.5 * local_56c * (float)iVar7) / (float)*piVar16;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).maxCoord,2);
    fVar17 = *pfVar10;
    pfVar10 = tcu::Vector<float,_4>::operator[](&(this->m_lookupSpec).minCoord,2);
    fVar3 = *pfVar10;
    iVar7 = (this->m_textureSpec).depth;
    piVar16 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)&proj,1);
    local_514 = ((fVar17 - fVar3) * 0.5 * local_56c * (float)iVar7) / (float)*piVar16;
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,dwdx,0.0,local_510,0.0,dwdy,local_514);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              (&local_560,this->m_texture3D,&(this->m_textureSpec).sampler);
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,&local_560);
  }
  *(undefined8 *)(this->m_lookupParams).scale.m_data = fmtInfo.valueMax.m_data._8_8_;
  *(undefined8 *)((this->m_lookupParams).scale.m_data + 2) = fmtInfo.lookupScale.m_data._0_8_;
  *(undefined8 *)(this->m_lookupParams).bias.m_data = fmtInfo.lookupScale.m_data._8_8_;
  *(undefined8 *)((this->m_lookupParams).bias.m_data + 2) = fmtInfo.lookupBias.m_data._0_8_;
  *(undefined8 *)(this->m_lookupParams).offset.m_data =
       *(undefined8 *)(this->m_lookupSpec).offset.m_data;
  (this->m_lookupParams).offset.m_data[2] = (this->m_lookupSpec).offset.m_data[2];
  return;
}

Assistant:

void ShaderTextureFunctionCase::initTexture (void)
{
	static const IVec4 texCubeSwz[] =
	{
		IVec4(0,0,1,1),
		IVec4(1,1,0,0),
		IVec4(0,1,0,1),
		IVec4(1,0,1,0),
		IVec4(0,1,1,0),
		IVec4(1,0,0,1)
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(texCubeSwz) == tcu::CUBEFACE_LAST);

	tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_textureSpec.format);
	tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	tcu::IVec2				viewportSize	= getViewportSize();
	bool					isProj			= functionHasProj(m_lookupSpec.function);
	bool					isAutoLod		= functionHasAutoLod(m_isVertexCase ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT,
																 m_lookupSpec.function); // LOD can vary significantly
	float					proj			= isProj ? 1.0f/m_lookupSpec.minCoord[m_lookupSpec.function == FUNCTION_TEXTUREPROJ3 ? 2 : 3] : 1.0f;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2D = new glu::Texture2D(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*levelStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture2D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture2D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture2D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2D, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			Vec4	cCorner			= cBias + cScale*0.5f;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			DE_ASSERT(m_textureSpec.width == m_textureSpec.height);
			m_textureCube = new glu::TextureCube(m_renderCtx, m_textureSpec.format, m_textureSpec.width);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*levelStep;
				float	fB		= 1.0f-fA;
				Vec2	f		(fA, fB);

				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				{
					const IVec4&	swzA	= texCubeSwz[face];
					IVec4			swzB	= 1-swzA;
					Vec4			colorA	= cBias + cScale*f.swizzle(swzA[0], swzA[1], swzA[2], swzA[3]);
					Vec4			colorB	= cBias + cScale*f.swizzle(swzB[0], swzB[1], swzB[2], swzB[3]);

					m_textureCube->getRefTexture().allocLevel((tcu::CubeFace)face, level);

					{
						const tcu::PixelBufferAccess	access		= m_textureCube->getRefTexture().getLevelFace(level, (tcu::CubeFace)face);
						const int						lastPix		= access.getWidth()-1;

						tcu::fillWithGrid(access, de::max(1, baseCellSize>>level), colorA, colorB);

						// Ensure all corners have identical colors in order to avoid dealing with ambiguous corner texel filtering
						access.setPixel(cCorner, 0, 0);
						access.setPixel(cCorner, 0, lastPix);
						access.setPixel(cCorner, lastPix, 0);
						access.setPixel(cCorner, lastPix, lastPix);
					}
				}
			}
			m_textureCube->upload();

			// Compute LOD \note Assumes that only single side is accessed and R is constant major axis.
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[2] - m_lookupSpec.maxCoord[2]) < 0.005);
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[0]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[0]) < de::abs(m_lookupSpec.minCoord[2]));
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[1]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[1]) < de::abs(m_lookupSpec.minCoord[2]));

			tcu::CubeFaceFloatCoords	c00		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c10		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.maxCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c01		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.maxCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			float						dudx	= (c10.s - c00.s)*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float						dvdy	= (c01.t - c00.t)*(float)m_textureSpec.height	/ (float)viewportSize[1];

			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			m_textures.push_back(gls::TextureBinding(m_textureCube, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_2D_ARRAY:
		{
			float	layerStep		= 1.0f / (float)m_textureSpec.depth;
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)(de::max(1, m_textureSpec.numLevels-1)*m_textureSpec.depth);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2DArray = new glu::Texture2DArray(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				m_texture2DArray->getRefTexture().allocLevel(level);
				tcu::PixelBufferAccess levelAccess = m_texture2DArray->getRefTexture().getLevel(level);

				for (int layer = 0; layer < levelAccess.getDepth(); layer++)
				{
					float	fA		= (float)layer*layerStep + (float)level*levelStep;
					float	fB		= 1.0f-fA;
					Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
					Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

					tcu::fillWithGrid(tcu::getSubregion(levelAccess, 0, 0, layer, levelAccess.getWidth(), levelAccess.getHeight(), 1), de::max(1, baseCellSize>>level), colorA, colorB);
				}
			}
			m_texture2DArray->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2DArray, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_3D:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(de::min(m_textureSpec.width/2, m_textureSpec.height/2), m_textureSpec.depth/2);

			m_texture3D = new glu::Texture3D(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= (float)level*levelStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture3D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture3D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture3D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width		/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height		/ (float)viewportSize[1];
			float dwdx = (m_lookupSpec.maxCoord[2]-m_lookupSpec.minCoord[2])*0.5f*proj*(float)m_textureSpec.depth	/ (float)viewportSize[0];
			float dwdy = (m_lookupSpec.maxCoord[2]-m_lookupSpec.minCoord[2])*0.5f*proj*(float)m_textureSpec.depth	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, dwdx, 0.0f, dvdy, dwdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture3D, m_textureSpec.sampler));
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Set lookup scale & bias
	m_lookupParams.scale	= fmtInfo.lookupScale;
	m_lookupParams.bias		= fmtInfo.lookupBias;
	m_lookupParams.offset	= m_lookupSpec.offset;
}